

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteSpherical.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkRevoluteSpherical::ChLinkRevoluteSpherical(ChLinkRevoluteSpherical *this)

{
  ChLink::ChLink(&this->super_ChLink);
  (this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLinkRevoluteSpherical_00b45468;
  (this->m_pos1).m_data[0] = 0.0;
  (this->m_pos1).m_data[1] = 0.0;
  (this->m_pos1).m_data[2] = 0.0;
  (this->m_pos2).m_data[0] = 0.0;
  (this->m_pos2).m_data[1] = 0.0;
  (this->m_pos2).m_data[2] = 0.0;
  (this->m_dir1).m_data[0] = 0.0;
  (this->m_dir1).m_data[1] = 0.0;
  (this->m_dir1).m_data[2] = 1.0;
  this->m_dist = (double)SUB168(ZEXT416(0) << 0x40,0);
  this->m_cur_dist = (double)SUB168(ZEXT416(0) << 0x40,8);
  this->m_cur_dot = 0.0;
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->m_cnstr_dist);
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->m_cnstr_dot);
  this->m_multipliers[0] = 0.0;
  this->m_multipliers[1] = 0.0;
  return;
}

Assistant:

ChLinkRevoluteSpherical::ChLinkRevoluteSpherical()
    : m_pos1(ChVector<>(0, 0, 0)),
      m_pos2(ChVector<>(0, 0, 0)),
      m_dir1(ChVector<>(0, 0, 1)),
      m_dist(0),
      m_cur_dist(0),
      m_cur_dot(0) {
    m_multipliers[0] = 0;
    m_multipliers[1] = 0;
}